

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O2

void luaE_freeCI(lua_State *L)

{
  CallInfo *pCVar1;
  CallInfo *block;
  
  block = L->ci->next;
  L->ci->next = (CallInfo *)0x0;
  while (block != (CallInfo *)0x0) {
    pCVar1 = block->next;
    luaM_realloc_(L,block,0x48,0);
    L->nci = L->nci - 1;
    block = pCVar1;
  }
  return;
}

Assistant:

void luaE_freeCI(lua_State *L) {
    CallInfo *ci = L->ci;
    CallInfo *next = ci->next;
    ci->next = NULL;
    while ((ci = next) != NULL) {
        next = ci->next;
        luaM_free(L, ci);
        L->nci--;
    }
}